

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O3

bool anon_unknown.dwarf_baa8f::testVector(void)

{
  char cVar1;
  bool bVar2;
  Value *this;
  ostream *poVar3;
  int iVar4;
  long *plVar5;
  long lVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  Value v;
  cmJSONState state;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  *local_148;
  ValueHolder local_140 [2];
  long local_130 [2];
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  long *local_100 [2];
  long local_f0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  Value local_b0;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  local_88;
  vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_> vStack_70;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  
  Json::Value::Value(&local_b0,arrayValue);
  vStack_70.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_70.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_70.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50 = 0;
  local_48 = 0;
  local_58 = &local_48;
  Json::Value::Value((Value *)local_140,"Hello");
  Json::Value::append(&local_b0,(Value *)local_140);
  Json::Value::~Value((Value *)local_140);
  Json::Value::Value((Value *)local_140,"world!");
  Json::Value::append(&local_b0,(Value *)local_140);
  Json::Value::~Value((Value *)local_140);
  Json::Value::Value((Value *)local_140,"ignore");
  Json::Value::append(&local_b0,(Value *)local_140);
  Json::Value::~Value((Value *)local_140);
  local_140[0].string_ = (char *)local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"default","");
  __l._M_len = 1;
  __l._M_array = (iterator)local_140;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e0,__l,(allocator_type *)&local_c8);
  if (local_140[0] != local_130) {
    operator_delete(local_140[0].string_,local_130[0] + 1);
  }
  local_140[0].string_ = (char *)local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"Hello","");
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"world!","");
  plVar5 = local_f0;
  local_100[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"ignore","");
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_140;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c8,__l_00,(allocator_type *)&local_148);
  lVar6 = -0x60;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  local_140[0].string_ = (char *)&local_b0;
  if ((anonymous_namespace)::StringVectorHelper_abi_cxx11_._16_8_ == 0) goto LAB_001b4857;
  local_148 = &local_88;
  cVar1 = (*(code *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_._24_8_)
                    ((anonymous_namespace)::StringVectorHelper_abi_cxx11_,&local_e0,local_140,
                     &local_148);
  if (cVar1 == '\0') {
    iVar4 = 0x14b;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ASSERT_TRUE(StringVectorHelper(l, &v, &state)) failed on line ",0x3e);
  }
  else {
    if ((long)local_e0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_e0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
        (long)local_c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
      bVar2 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                        (local_e0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_e0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         local_c8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      if (bVar2) {
        Json::Value::Value((Value *)local_140,2);
        this = Json::Value::operator[](&local_b0,1);
        Json::Value::operator=(this,(Value *)local_140);
        Json::Value::~Value((Value *)local_140);
        local_140[0].string_ = (char *)local_130;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"default","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_assign_aux<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e0,
                   local_140,local_120);
        if (local_140[0] != local_130) {
          operator_delete(local_140[0].string_,local_130[0] + 1);
        }
        local_140[0].string_ = (char *)&local_b0;
        if ((anonymous_namespace)::StringVectorHelper_abi_cxx11_._16_8_ == 0) {
LAB_001b4857:
          local_148 = &local_88;
          std::__throw_bad_function_call();
        }
        local_148 = &local_88;
        cVar1 = (*(code *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_._24_8_)
                          ((anonymous_namespace)::StringVectorHelper_abi_cxx11_,&local_e0,local_140,
                           &local_148);
        if (cVar1 == '\0') {
          Json::Value::Value((Value *)local_140,"Hello");
          Json::Value::operator=(&local_b0,(Value *)local_140);
          Json::Value::~Value((Value *)local_140);
          local_140[0].string_ = (char *)local_130;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"default","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_assign_aux<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e0,
                     local_140,local_120);
          if (local_140[0] != local_130) {
            operator_delete(local_140[0].string_,local_130[0] + 1);
          }
          local_140[0].string_ = (char *)&local_b0;
          if ((anonymous_namespace)::StringVectorHelper_abi_cxx11_._16_8_ == 0) goto LAB_001b4857;
          local_148 = &local_88;
          cVar1 = (*(code *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_._24_8_)
                            ((anonymous_namespace)::StringVectorHelper_abi_cxx11_,&local_e0,
                             local_140,&local_148);
          if (cVar1 == '\0') {
            local_140[0].string_ = (char *)local_130;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"default","");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_assign_aux<std::__cxx11::string_const*>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_e0,local_140,local_120);
            if (local_140[0] != local_130) {
              operator_delete(local_140[0].string_,local_130[0] + 1);
            }
            local_140[0].int_ = 0;
            if ((anonymous_namespace)::StringVectorHelper_abi_cxx11_._16_8_ == 0) goto LAB_001b4857;
            local_148 = &local_88;
            cVar1 = (*(code *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_._24_8_)
                              ((anonymous_namespace)::StringVectorHelper_abi_cxx11_,&local_e0,
                               local_140,&local_148);
            if (cVar1 == '\0') {
              iVar4 = 0x157;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "ASSERT_TRUE(StringVectorHelper(l, nullptr, &state)) failed on line ",0x43)
              ;
            }
            else {
              if (local_e0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  local_e0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                bVar2 = true;
                goto LAB_001b4648;
              }
              iVar4 = 0x158;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"ASSERT_TRUE(l.empty()) failed on line ",0x26);
            }
          }
          else {
            iVar4 = 0x154;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "ASSERT_TRUE(!StringVectorHelper(l, &v, &state)) failed on line ",0x3f);
          }
        }
        else {
          iVar4 = 0x150;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ASSERT_TRUE(!StringVectorHelper(l, &v, &state)) failed on line ",0x3f);
        }
        goto LAB_001b4624;
      }
    }
    iVar4 = 0x14c;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(l == expected) failed on line ",0x2a);
  }
LAB_001b4624:
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  bVar2 = false;
LAB_001b4648:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0);
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  std::vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>::~vector(&vStack_70);
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ::~vector(&local_88);
  Json::Value::~Value(&local_b0);
  return bVar2;
}

Assistant:

bool testVector()
{
  Json::Value v(Json::arrayValue);
  cmJSONState state;
  v.append("Hello");
  v.append("world!");
  v.append("ignore");

  std::vector<std::string> l{ "default" };
  std::vector<std::string> expected{ "Hello", "world!", "ignore" };
  ASSERT_TRUE(StringVectorHelper(l, &v, &state));
  ASSERT_TRUE(l == expected);

  v[1] = 2;
  l = { "default" };
  ASSERT_TRUE(!StringVectorHelper(l, &v, &state));

  v = "Hello";
  l = { "default" };
  ASSERT_TRUE(!StringVectorHelper(l, &v, &state));

  l = { "default" };
  ASSERT_TRUE(StringVectorHelper(l, nullptr, &state));
  ASSERT_TRUE(l.empty());

  return true;
}